

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_NtkMatch(Ifn_Ntk_t *p,word *pTruth,int nVars,int nConfls,int fVerbose,int fVeryVerbose,
                word *pConfig)

{
  int *pValues;
  word *pwVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  sat_solver *s;
  ulong *puVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  timespec ts;
  ulong local_78;
  int local_70;
  timespec local_68;
  long local_58;
  uint local_4c;
  int local_48;
  int local_44;
  word *local_40;
  long local_38;
  long lVar16;
  
  uVar11 = 1 << ((byte)nVars & 0x1f);
  iVar3 = clock_gettime(3,&local_68);
  if (iVar3 < 0) {
    local_58 = -1;
  }
  else {
    local_58 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  if (nVars == 0) {
    return 1;
  }
  local_48 = fVerbose;
  s = sat_solver_new();
  Ifn_Prepare(p,pTruth,nVars);
  sat_solver_setnvars(s,p->nPars);
  Ifn_NtkAddConstraints(p,s);
  if (fVeryVerbose != 0) {
    iVar3 = clock_gettime(3,&local_68);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Ifn_NtkMatchPrintStatus(s,0,1,-1,-1,lVar10 - local_58);
  }
  if ((pConfig != (word *)0x0) && (*pConfig != 0)) {
    __assert_fail("*pConfig == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTune.c"
                  ,0x541,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
  }
  if (nVars != 0x1f) {
    pValues = p->Values;
    local_38 = (long)nConfls;
    if ((int)uVar11 < 2) {
      uVar11 = 1;
    }
    uVar7 = 0;
    local_78 = 0;
    local_4c = uVar11;
    local_40 = pTruth;
    do {
      auVar2 = _DAT_00912220;
      iVar3 = p->nObjs;
      lVar10 = (long)iVar3;
      uVar11 = (uint)uVar7;
      if (0 < lVar10) {
        iVar4 = p->nVars;
        lVar8 = lVar10 + -1;
        auVar14._8_4_ = (int)lVar8;
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
        lVar8 = 1;
        auVar14 = auVar14 ^ _DAT_00912220;
        uVar9 = 0;
        auVar15 = _DAT_00912210;
        do {
          auVar17 = auVar15 ^ auVar2;
          if ((bool)(~(auVar14._4_4_ < auVar17._4_4_ ||
                      auVar14._0_4_ < auVar17._0_4_ && auVar17._4_4_ == auVar14._4_4_) & 1)) {
            uVar6 = (uint)((uVar11 >> ((uint)uVar9 & 0x1f) & 1) != 0);
            if ((long)iVar4 <= (long)uVar9) {
              uVar6 = 0xffffffff;
            }
            p->Values[uVar9] = uVar6;
          }
          if (auVar17._12_4_ <= auVar14._12_4_ &&
              (auVar17._8_4_ <= auVar14._8_4_ || auVar17._12_4_ != auVar14._12_4_)) {
            uVar6 = (uint)((uVar11 >> ((uint)lVar8 & 0x1f) & 1) != 0);
            if (iVar4 <= lVar8) {
              uVar6 = 0xffffffff;
            }
            p->Values[uVar9 + 1] = uVar6;
          }
          uVar9 = uVar9 + 2;
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar16 + 2;
          lVar8 = lVar8 + 2;
        } while ((iVar3 + 1U & 0xfffffffe) != uVar9);
      }
      p->Values[lVar10 + -1] = (uint)((pTruth[(int)uVar11 >> 6] >> (uVar7 & 0x3f) & 1) != 0);
      iVar3 = Ifn_NtkAddClauses(p,pValues,s);
      local_70 = 0;
      bVar13 = true;
      if (iVar3 == 0) goto LAB_00415d32;
      iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,local_38,0,0,0);
      if (fVeryVerbose != 0) {
        local_44 = p->Values[(long)p->nObjs + -1];
        iVar4 = clock_gettime(3,&local_68);
        if (iVar4 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
        }
        Ifn_NtkMatchPrintStatus(s,(int)local_78 + 1,iVar3,uVar11,local_44,lVar10 - local_58);
      }
      pTruth = local_40;
      if (iVar3 != 1) goto LAB_00415d32;
      uVar11 = p->nObjs;
      uVar7 = (ulong)uVar11;
      iVar3 = p->nPars;
      uVar6 = uVar11;
      while ((int)uVar6 < iVar3) {
        if (((int)uVar11 < 0) || (s->size <= (int)uVar7)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        pValues[uVar7] = (uint)(s->model[uVar7] == 1);
        uVar7 = uVar7 + 1;
        uVar6 = (uint)uVar7;
      }
      puVar5 = Ifn_NtkDeriveTruth(p,pValues);
      iVar3 = p->nWords;
      if (0 < (long)iVar3) {
        pwVar1 = p->pTruth;
        lVar10 = 0;
        do {
          puVar5[lVar10] = puVar5[lVar10] ^ pwVar1[lVar10];
          lVar10 = lVar10 + 1;
        } while (iVar3 != lVar10);
      }
      uVar11 = 1 << ((char)p->nVars - 6U & 0x1f);
      if (p->nVars < 7) {
        uVar11 = 1;
      }
      if ((int)uVar11 < 1) {
LAB_00415d0f:
        local_70 = 1;
        if (pConfig != (word *)0x0) {
          Ifn_NtkMatchCollectConfig(p,s,pConfig);
        }
        bVar13 = false;
LAB_00415d32:
        if (local_48 != 0) {
          pcVar12 = "yes";
          if (bVar13) {
            pcVar12 = "no ";
          }
          uVar11 = sat_solver_nconflicts(s);
          printf("%s  Iter =%4d. Confl = %6d.  ",pcVar12,local_78,(ulong)uVar11);
          if (!bVar13) {
            Ifn_NtkMatchPrintConfig(p,s);
          }
          putchar(10);
        }
        sat_solver_delete(s);
        return local_70;
      }
      lVar10 = 0;
      while (uVar7 = *puVar5, uVar7 == 0) {
        lVar10 = lVar10 + -0x40;
        puVar5 = puVar5 + 1;
        if ((ulong)uVar11 * 0x40 + lVar10 == 0) goto LAB_00415d0f;
      }
      bVar13 = (int)uVar7 == 0;
      uVar9 = uVar7 >> 0x20;
      if (!bVar13) {
        uVar9 = uVar7;
      }
      iVar4 = (uint)bVar13 * 0x20;
      iVar3 = iVar4 + 0x10;
      uVar7 = uVar9 >> 0x10;
      if ((short)uVar9 != 0) {
        iVar3 = iVar4;
        uVar7 = uVar9;
      }
      iVar4 = iVar3 + 8;
      uVar9 = uVar7 >> 8;
      if ((char)uVar7 != '\0') {
        iVar4 = iVar3;
        uVar9 = uVar7;
      }
      iVar3 = iVar4 + 4;
      uVar7 = uVar9 >> 4;
      if ((uVar9 & 0xf) != 0) {
        iVar3 = iVar4;
        uVar7 = uVar9;
      }
      uVar11 = (uint)(uVar7 >> 2) & 0x3fffffff;
      iVar4 = iVar3 + 2;
      if ((uVar7 & 3) != 0) {
        uVar11 = (uint)uVar7;
        iVar4 = iVar3;
      }
      uVar11 = (~uVar11 & 1) + iVar4;
      if ((int)lVar10 - uVar11 == 1) goto LAB_00415d0f;
      uVar7 = (ulong)uVar11 - lVar10;
      uVar11 = (int)local_78 + 1;
      local_78 = (ulong)uVar11;
    } while (uVar11 != local_4c);
  }
  __assert_fail("i < nIterMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTune.c"
                ,0x56e,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
}

Assistant:

int Ifn_NtkMatch( Ifn_Ntk_t * p, word * pTruth, int nVars, int nConfls, int fVerbose, int fVeryVerbose, word * pConfig )
{
    word * pTruth1;
    int RetValue = 0;
    int nIterMax = (1<<nVars);
    int i, v, status, iMint = 0;
    abctime clk = Abc_Clock();
//    abctime clkTru = 0, clkSat = 0, clk2;
    sat_solver * pSat;
    if ( nVars == 0 )
        return 1;
    pSat = sat_solver_new();
    Ifn_Prepare( p, pTruth, nVars );
    sat_solver_setnvars( pSat, p->nPars );
    Ifn_NtkAddConstraints( p, pSat );
    if ( fVeryVerbose )
        Ifn_NtkMatchPrintStatus( pSat, 0, l_True, -1, -1, Abc_Clock() - clk );
    if ( pConfig ) assert( *pConfig == 0 );
    for ( i = 0; i < nIterMax; i++ )
    {
        // get variable assignment
        for ( v = 0; v < p->nObjs; v++ )
            p->Values[v] = v < p->nVars ? (iMint >> v) & 1 :  -1;
        p->Values[p->nObjs-1] = Abc_TtGetBit( pTruth, iMint );
        // derive clauses
        if ( !Ifn_NtkAddClauses( p, p->Values, pSat ) )
            break;
        // find assignment of parameters
//        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, nConfls, 0, 0, 0 );
//        clkSat += Abc_Clock() - clk2;
        if ( fVeryVerbose )
            Ifn_NtkMatchPrintStatus( pSat, i+1, status, iMint, p->Values[p->nObjs-1], Abc_Clock() - clk );
        if ( status != l_True )
            break;
        // collect assignment
        for ( v = p->nObjs; v < p->nPars; v++ )
            p->Values[v] = sat_solver_var_value(pSat, v);
        // find truth table
//        clk2 = Abc_Clock();
        pTruth1 = Ifn_NtkDeriveTruth( p, p->Values );
//        clkTru += Abc_Clock() - clk2;
        Abc_TtXor( pTruth1, pTruth1, p->pTruth, p->nWords, 0 );
        // find mismatch if present
        iMint = Abc_TtFindFirstBit( pTruth1, p->nVars );
        if ( iMint == -1 )
        {
            if ( pConfig ) 
                Ifn_NtkMatchCollectConfig( p, pSat, pConfig );
/*
            if ( pPerm )
            {
                int RetValue = Ifn_ManSatFindCofigBitsTest( p, pTruth, nVars, *pPerm );
                Ifn_NtkMatchPrintPerm( *pPerm, p->nInps );
                if ( RetValue == 0 )
                    printf( "Verification failed.\n" );
            }
*/
            RetValue = 1;
            break;
        }
    }
    assert( i < nIterMax );
    if ( fVerbose )
    {
        printf( "%s  Iter =%4d. Confl = %6d.  ", RetValue ? "yes":"no ", i, sat_solver_nconflicts(pSat) );
        if ( RetValue )
            Ifn_NtkMatchPrintConfig( p, pSat );
        printf( "\n" );
    }
    sat_solver_delete( pSat );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Sat", clkSat );
//    Abc_PrintTime( 1, "Tru", clkTru );
    return RetValue;
}